

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O3

_Bool rtosc_match_full_path(char *pattern,char *message)

{
  char cVar1;
  char *m;
  
  cVar1 = *message;
  if (cVar1 != '\0' && *pattern == cVar1) {
    do {
    } while( true );
  }
  return *pattern == cVar1;
}

Assistant:

bool rtosc_match_full_path(const char *pattern, const char *message)
{
    assert(false && "This API is a WIP");
    char subpattern[256];
    char submessage[256];
    const char *p = pattern;
    const char *m = message;

step:
    if(*p != *m)
        return 0;
    if(chunk_path(subpattern, sizeof(subpattern), p))
        return 0;
    if(chunk_path(submessage, sizeof(submessage), m))
        return 0;

    advance_path(&p);
    advance_path(&m);

    if(*p == 0 && *m == 0)
        return 1;
    else
        goto step;
}